

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.hh
# Opt level: O3

void __thiscall
tchecker::pool_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>::destruct_all
          (pool_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_> *this)

{
  long *plVar1;
  long *plVar2;
  size_t sVar3;
  long *plVar4;
  long *plVar5;
  
  plVar1 = (long *)this->_block_head;
  if (plVar1 != (long *)0x0) {
    plVar2 = (long *)this->_raw_head;
    plVar4 = plVar1;
    do {
      sVar3 = this->_block_size;
      if (sVar3 != 8) {
        plVar5 = plVar4 + 1;
        do {
          if ((plVar2 <= plVar5) && (plVar5 < this->_raw_end)) break;
          if (*plVar5 != -1) {
            if (*plVar5 != 0) {
              __assert_fail("*refcount == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/pool.hh"
                            ,0x10b,
                            "void tchecker::pool_t<tchecker::make_shared_t<tchecker::vedge_t>>::destruct_all() [T = tchecker::make_shared_t<tchecker::vedge_t>]"
                           );
            }
            *plVar5 = -1;
          }
          plVar5 = (long *)((long)plVar5 + this->_alloc_size);
        } while (plVar5 != (long *)(sVar3 + (long)plVar4));
      }
      plVar4 = (long *)*plVar4;
    } while (plVar4 != (long *)0x0);
    while (plVar1 != (long *)0x0) {
      plVar2 = (long *)*plVar1;
      operator_delete__(plVar1);
      plVar1 = plVar2;
    }
  }
  this->_block_head = (char *)0x0;
  this->_raw_head = (char *)0x0;
  this->_blocks_count = 0;
  this->_free_head = (char *)0x0;
  this->_raw_end = (char *)0x0;
  return;
}

Assistant:

void destruct_all()
  {
    // Call destructor on all chunks in blocks list that
    // - are not in free list
    // - are not in raw block
    for (void * block = _block_head; block != nullptr; block = nextblock(block)) {
      void * block_end = static_cast<char *>(block) + _block_size;

      for (char * chunk = first_chunk_ptr(block); chunk != block_end; chunk += _alloc_size) {
        // Ignore chunks inside unused raw block
        if ((_raw_head <= chunk) && (chunk < _raw_end))
          break;

        // Destruct all chunks that are not free
        typename T::refcount_t * refcount = reinterpret_cast<typename T::refcount_t *>(chunk);

        if (*refcount > T::REFCOUNT_MAX)
          continue;

        assert(*refcount == 0);
        // make the chunk free using its refcount
        *refcount = FREE_CHUNK;
        // destruct the object in the chunk
        T * t = reinterpret_cast<T *>(refcount + 1);
        T::destruct(t); // t->~T();
      }
    }

    // Free memory
    free_all();
  }